

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

shared_ptr<pstore::broker::scavenger> __thiscall
pstore::broker::command_processor::atomic_weak_ptr<pstore::broker::scavenger>::get
          (atomic_weak_ptr<pstore::broker::scavenger> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *in_RSI;
  shared_ptr<pstore::broker::scavenger> sVar1;
  
  std::mutex::lock((mutex *)&in_RSI->__data);
  std::__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)this,in_RSI + 1)
  ;
  pthread_mutex_unlock(in_RSI);
  sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstore::broker::scavenger>)
         sVar1.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> get () {
                    std::lock_guard<decltype (mut_)> const lock{mut_};
                    return ptr_.lock ();
                }